

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::String::_opNumber
          (String *this,ModifyOp op,uint64_t i,uint32_t base,size_t width,StringFormatFlags flags)

{
  bool bVar1;
  uint32_t uVar2;
  Error EVar3;
  String *pSVar4;
  char *__n;
  char *__dest;
  int in_ECX;
  ulong uVar5;
  String *in_RDX;
  char *pcVar6;
  char *in_R8;
  char *data;
  size_t prefixSize;
  size_t numberSize;
  uint64_t r_1;
  uint64_t d_1;
  size_t r;
  uint64_t d;
  uint32_t mask;
  uint32_t shift;
  char sign;
  uint64_t orig;
  char *p;
  char buf [128];
  undefined8 in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint3 in_stack_ffffffffffffff34;
  ModifyOp op_00;
  char cVar7;
  char *local_c0;
  char acStack_38 [8];
  char *local_30;
  int local_24;
  String *local_20;
  Error local_4;
  
  local_24 = in_ECX;
  if (in_ECX == 0) {
    local_24 = 10;
  }
  op_00 = (ModifyOp)in_stack_ffffffffffffff34;
  local_30 = in_R8;
  local_20 = in_RDX;
  bVar1 = Support::test<asmjit::_abi_1_10::StringFormatFlags,asmjit::_abi_1_10::StringFormatFlags>
                    ((StringFormatFlags)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                     (StringFormatFlags)in_stack_fffffffffffffee0);
  if ((bVar1) && ((long)local_20 < 0)) {
    local_20 = (String *)-(long)local_20;
    op_00 = CONCAT13(0x2d,(int3)op_00);
  }
  else {
    bVar1 = Support::test<asmjit::_abi_1_10::StringFormatFlags,asmjit::_abi_1_10::StringFormatFlags>
                      ((StringFormatFlags)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                       (StringFormatFlags)in_stack_fffffffffffffee0);
    if (bVar1) {
      op_00 = CONCAT13(0x2b,(int3)op_00);
    }
    else {
      bVar1 = Support::
              test<asmjit::_abi_1_10::StringFormatFlags,asmjit::_abi_1_10::StringFormatFlags>
                        ((StringFormatFlags)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (StringFormatFlags)in_stack_fffffffffffffee0);
      if (bVar1) {
        op_00 = CONCAT13(0x20,(int3)op_00);
      }
    }
  }
  uVar5 = (ulong)(local_24 - 2);
  switch(uVar5) {
  case 0:
  case 6:
  case 0xe:
    uVar2 = Support::ctz<unsigned_int>(0);
    in_stack_ffffffffffffff2c = local_24 - 1;
    local_c0 = acStack_38;
    do {
      pSVar4 = (String *)((ulong)local_20 >> ((byte)uVar2 & 0x3f));
      pcVar6 = local_c0 + -1;
      local_c0[-1] = "0123456789ABCDEF"[(ulong)local_20 & (ulong)in_stack_ffffffffffffff2c];
      local_c0 = pcVar6;
      local_20 = pSVar4;
    } while (pSVar4 != (String *)0x0);
    break;
  default:
    EVar3 = DebugUtils::errored(2);
    return EVar3;
  case 8:
    local_c0 = acStack_38;
    do {
      pSVar4 = (String *)((ulong)local_20 / 10);
      pcVar6 = local_c0 + -1;
      local_c0[-1] = (char)((ulong)local_20 % 10) + '0';
      local_c0 = pcVar6;
      local_20 = pSVar4;
    } while (pSVar4 != (String *)0x0);
  }
  local_20 = (String *)0x0;
  pcVar6 = acStack_38 + -(long)local_c0;
  bVar1 = Support::test<asmjit::_abi_1_10::StringFormatFlags,asmjit::_abi_1_10::StringFormatFlags>
                    ((StringFormatFlags)(uVar5 >> 0x20),(StringFormatFlags)uVar5);
  if (bVar1) {
    if ((local_24 == 8) && (in_RDX != (String *)0x0)) {
      local_c0[-1] = '0';
      local_c0 = local_c0 + -1;
    }
    if (local_24 == 0x10) {
      local_c0[-1] = 'x';
      local_c0[-2] = '0';
      local_c0 = local_c0 + -2;
    }
  }
  cVar7 = (char)(op_00 >> 0x18);
  if (cVar7 != '\0') {
    local_c0[-1] = cVar7;
    local_c0 = local_c0 + -1;
  }
  if ((char *)0x100 < local_30) {
    local_30 = (char *)0x100;
  }
  if (pcVar6 < local_30) {
    local_30 = (char *)((long)local_30 - (long)pcVar6);
  }
  else {
    local_30 = (char *)0x0;
  }
  __n = acStack_38 + (-(long)pcVar6 - (long)local_c0);
  __dest = prepare(in_RDX,op_00,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (__dest == (char *)0x0) {
    local_4 = DebugUtils::errored(1);
  }
  else {
    memcpy(__dest,local_c0,(size_t)__n);
    memset(__dest + (long)__n,0x30,(size_t)local_30);
    memcpy(__dest + (long)__n + (long)local_30,local_c0 + (long)__n,(size_t)pcVar6);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Error String::_opNumber(ModifyOp op, uint64_t i, uint32_t base, size_t width, StringFormatFlags flags) noexcept {
  if (base == 0)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // Format Sign
  // -----------

  if (Support::test(flags, StringFormatFlags::kSigned) && int64_t(i) < 0) {
    i = uint64_t(-int64_t(i));
    sign = '-';
  }
  else if (Support::test(flags, StringFormatFlags::kShowSign)) {
    sign = '+';
  }
  else if (Support::test(flags, StringFormatFlags::kShowSpace)) {
    sign = ' ';
  }

  // Format Number
  // -------------

  switch (base) {
    case 2:
    case 8:
    case 16: {
      uint32_t shift = Support::ctz(base);
      uint32_t mask = base - 1;

      do {
        uint64_t d = i >> shift;
        size_t r = size_t(i & mask);

        *--p = String_baseN[r];
        i = d;
      } while (i);

      break;
    }

    case 10: {
      do {
        uint64_t d = i / 10;
        uint64_t r = i % 10;

        *--p = char(uint32_t('0') + uint32_t(r));
        i = d;
      } while (i);

      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  size_t numberSize = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // Alternate Form
  // --------------

  if (Support::test(flags, StringFormatFlags::kAlternate)) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // String Width
  // ------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberSize)
    width = 0;
  else
    width -= numberSize;

  // Finalize
  // --------

  size_t prefixSize = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberSize;
  char* data = prepare(op, prefixSize + width + numberSize);

  if (!data)
    return DebugUtils::errored(kErrorOutOfMemory);

  memcpy(data, p, prefixSize);
  data += prefixSize;

  memset(data, '0', width);
  data += width;

  memcpy(data, p + prefixSize, numberSize);
  return kErrorOk;
}